

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# trodesglobaltypes.cpp
# Opt level: O3

void __thiscall
GlobalStimulationSettings::GlobalStimulationSettings(GlobalStimulationSettings *this)

{
  NetworkDataType::NetworkDataType(&this->super_NetworkDataType);
  (this->super_NetworkDataType)._vptr_NetworkDataType = (_func_int **)&PTR__NetworkDataType_002e79c0
  ;
  this->use_DC_amp = false;
  this->scaleValue = max1uA;
  this->settle_All_Channels_If_One_Channel_Is_Settling = false;
  this->settle_Same_Chip_If_One_Channel_Is_Settling = false;
  this->use_Fast_Settle_For_Amp_Settle_Mode = true;
  this->use_Switch_For_Charge_Recovery = true;
  return;
}

Assistant:

GlobalStimulationSettings::GlobalStimulationSettings() {
    //Global mode settings
    settle_All_Channels_If_One_Channel_Is_Settling = false;
    settle_Same_Chip_If_One_Channel_Is_Settling = false;
    use_Fast_Settle_For_Amp_Settle_Mode = true; //false makes it use amplifier low frequency cutoff instead
    use_Switch_For_Charge_Recovery = true; //false makes it use current-limited drivers instead
    use_DC_amp = false;  //for 10 bit DC amplifiers. False makes it use 16 bit AC amplifiers
    scaleValue = max1uA;

}